

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void ImGui::Dummy(ImVec2 *size)

{
  ImGuiWindow *pIVar1;
  ImRect bb;
  ImRect local_18;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    local_18.Min.x = (pIVar1->DC).CursorPos.x;
    local_18.Min.y = (pIVar1->DC).CursorPos.y;
    local_18.Max.x = (*size).x + local_18.Min.x;
    local_18.Max.y = (*size).y + local_18.Min.y;
    ItemSize(size,-1.0);
    ItemAdd(&local_18,0,(ImRect *)0x0,0);
  }
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }